

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  byte bVar2;
  sqlite3_vfs *psVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  void *pvVar10;
  _func_void *p_Var11;
  ulong uVar12;
  byte *pbVar13;
  size_t sVar14;
  char *zBuf;
  void **__dest;
  uint uVar15;
  int rc;
  sqlite3_uint64 n;
  char *local_58;
  void *local_40;
  sqlite3 *local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_40 = (void *)0x0;
  sVar8 = strlen(zFile);
  if (pzErrMsg == (char **)0x0) {
    if ((db->flags & 0x10000) != 0) goto LAB_0015125a;
  }
  else {
    *pzErrMsg = (char *)0x0;
    if ((db->flags & 0x10000) != 0) {
LAB_0015125a:
      local_58 = "sqlite3_extension_init";
      if (zProc != (char *)0x0) {
        local_58 = zProc;
      }
      if (sVar8 < 0x1001) {
        local_38 = db;
        pvVar10 = (*psVar3->xDlOpen)(psVar3,zFile);
        bVar5 = true;
        while ((db = local_38, bVar5 && (pvVar10 == (void *)0x0))) {
          pcVar9 = sqlite3_mprintf("%s.%s",zFile,"so");
          db = local_38;
          if (pcVar9 == (char *)0x0) goto LAB_001513be;
          pvVar10 = (*psVar3->xDlOpen)(psVar3,pcVar9);
          sqlite3_free(pcVar9);
          bVar5 = false;
        }
        if (pvVar10 == (void *)0x0) goto LAB_0015127a;
        p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,local_58);
        if (zProc == (char *)0x0 && p_Var11 == (_func_void *)0x0) {
          uVar6 = sqlite3Strlen30(zFile);
          pcVar9 = (char *)sqlite3_malloc64((ulong)(uVar6 + 0x1e));
          if (pcVar9 == (char *)0x0) {
            (*psVar3->xDlClose)(psVar3,pvVar10);
LAB_001513be:
            rc = 7;
            goto LAB_0015155b;
          }
          builtin_strncpy(pcVar9,"sqlite3_",8);
          uVar12 = (ulong)uVar6;
          do {
            if ((long)uVar12 < 1) {
              uVar6 = 0;
              goto LAB_001513de;
            }
            uVar1 = uVar12 - 1;
            lVar4 = uVar12 - 1;
            uVar12 = uVar1;
          } while (zFile[lVar4] != '/');
          uVar6 = (int)uVar1 + 1;
LAB_001513de:
          iVar7 = sqlite3_strnicmp(zFile + uVar6,"lib",3);
          uVar15 = uVar6 + 3;
          if (iVar7 != 0) {
            uVar15 = uVar6;
          }
          pbVar13 = (byte *)(zFile + (int)uVar15);
          iVar7 = 8;
          while( true ) {
            bVar2 = *pbVar13;
            if ((bVar2 == 0) || (bVar2 == 0x2e)) break;
            if ((""[bVar2] & 2) != 0) {
              pcVar9[iVar7] = ""[(uint)(int)(char)bVar2];
              iVar7 = iVar7 + 1;
            }
            pbVar13 = pbVar13 + 1;
          }
          (pcVar9 + (long)iVar7 + 4)[0] = 't';
          (pcVar9 + (long)iVar7 + 4)[1] = '\0';
          builtin_strncpy(pcVar9 + iVar7,"_ini",4);
          p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,pcVar9);
          local_58 = pcVar9;
        }
        else {
          pcVar9 = (char *)0x0;
        }
        if (p_Var11 == (_func_void *)0x0) {
          if (pzErrMsg != (char **)0x0) {
            sVar14 = strlen(local_58);
            n = sVar8 + sVar14 + 300;
            zBuf = (char *)sqlite3_malloc64(n);
            *pzErrMsg = zBuf;
            if (zBuf != (char *)0x0) {
              iVar7 = (int)n;
              sqlite3_snprintf(iVar7,zBuf,"no entry point [%s] in shared library [%s]",local_58,
                               zFile);
              (*psVar3->xDlError)(psVar3,iVar7 + -1,zBuf);
            }
          }
          (*psVar3->xDlClose)(psVar3,pvVar10);
          sqlite3_free(pcVar9);
        }
        else {
          sqlite3_free(pcVar9);
          iVar7 = (*p_Var11)(db,&local_40,&sqlite3Apis);
          if (iVar7 == 0) {
            __dest = (void **)sqlite3DbMallocZero(db,(long)db->nExtension * 8 + 8);
            rc = 7;
            if (__dest != (void **)0x0) {
              if (0 < (long)db->nExtension) {
                memcpy(__dest,db->aExtension,(long)db->nExtension << 3);
              }
              sqlite3DbFree(db,db->aExtension);
              db->aExtension = __dest;
              iVar7 = db->nExtension;
              db->nExtension = iVar7 + 1;
              __dest[iVar7] = pvVar10;
              rc = 0;
            }
            goto LAB_0015155b;
          }
          rc = 0;
          if (iVar7 == 0x100) goto LAB_0015155b;
          if (pzErrMsg != (char **)0x0) {
            pcVar9 = sqlite3_mprintf("error during initialization: %s",local_40);
            *pzErrMsg = pcVar9;
          }
          sqlite3_free(local_40);
          (*psVar3->xDlClose)(psVar3,pvVar10);
        }
      }
      else {
LAB_0015127a:
        if (pzErrMsg != (char **)0x0) {
          pcVar9 = (char *)sqlite3_malloc64(sVar8 + 300);
          *pzErrMsg = pcVar9;
          if (pcVar9 != (char *)0x0) {
            sqlite3_snprintf((int)(sVar8 + 300),pcVar9,"unable to open shared library [%.*s]",0x1000
                             ,zFile);
            (*psVar3->xDlError)(psVar3,(int)sVar8 + 299,pcVar9);
          }
          rc = 1;
          goto LAB_0015155b;
        }
      }
      rc = 1;
      goto LAB_0015155b;
    }
    pcVar9 = sqlite3_mprintf("not authorized");
    *pzErrMsg = pcVar9;
  }
  rc = 1;
LAB_0015155b:
  iVar7 = sqlite3ApiExit(db,rc);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar7;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}